

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tchecker::parsing::system::parser_t::value_type::emplace<std::__cxx11::string,std::__cxx11::string>
          (value_type *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    this->yytypeid_ = (type_info *)&std::__cxx11::string::typeinfo;
    psVar1 = (size_type *)((long)&this->field_0 + 0x10);
    *(size_type **)&this->field_0 = psVar1;
    pcVar3 = (u->_M_dataplus)._M_p;
    paVar2 = &u->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar2) {
      uVar4 = *(undefined8 *)((long)&u->field_2 + 8);
      *psVar1 = paVar2->_M_allocated_capacity;
      *(undefined8 *)((long)&this->field_0 + 0x18) = uVar4;
    }
    else {
      *(pointer *)&this->field_0 = pcVar3;
      *(size_type *)((long)&this->field_0 + 0x10) = paVar2->_M_allocated_capacity;
    }
    *(size_type *)((long)&this->field_0 + 8) = u->_M_string_length;
    (u->_M_dataplus)._M_p = (pointer)paVar2;
    u->_M_string_length = 0;
    (u->field_2)._M_local_buf[0] = '\0';
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  }
  __assert_fail("!yytypeid_",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O3/src/parsing/system_parser/system.tab.hh"
                ,0x110,
                "T &tchecker::parsing::system::parser_t::value_type::emplace(U &&...) [T = std::basic_string<char>, U = <std::basic_string<char>>]"
               );
}

Assistant:

T&
    emplace (U&&... u)
    {
      SPYY_ASSERT (!yytypeid_);
      SPYY_ASSERT (sizeof (T) <= size);
      yytypeid_ = & typeid (T);
      return *new (yyas_<T> ()) T (std::forward <U>(u)...);
    }